

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O0

newtRef NsExtractWord(newtRefArg rcvr,newtRefArg r,newtRefArg offset)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint32_t value;
  uint8_t *data;
  uint32_t p;
  uint32_t len;
  newtRefArg offset_local;
  newtRefArg r_local;
  newtRefArg rcvr_local;
  
  _Var1 = NewtRefIsBinary(r);
  if (_Var1) {
    _Var1 = NewtRefIsInteger(offset);
    if (_Var1) {
      uVar2 = NewtBinaryLength(r);
      uVar4 = NewtRefToInteger(offset);
      uVar3 = (uint)uVar4;
      if ((uVar3 < uVar2) && (uVar3 + 1 < uVar2)) {
        puVar5 = NewtRefToBinary(r);
        rcvr_local = NewtMakeInteger((ulong)CONCAT11(puVar5[uVar4 & 0xffffffff],puVar5[uVar3 + 1]));
      }
      else {
        rcvr_local = 0xfff2;
      }
    }
    else {
      rcvr_local = NewtThrow(-0xbd16,offset);
    }
  }
  else {
    rcvr_local = NewtThrow(-0xbd18,r);
  }
  return rcvr_local;
}

Assistant:

newtRef NsExtractWord(newtRefArg rcvr, newtRefArg r, newtRefArg offset)
{
    if (! NewtRefIsBinary(r))
        return NewtThrow(kNErrNotABinaryObject, r);
    
    if (! NewtRefIsInteger(offset))
        return NewtThrow(kNErrNotAnInteger, offset);
    
    uint32_t len = NewtBinaryLength(r);
    uint32_t p = (uint32_t)NewtRefToInteger(offset);
    
    if (p < len && p + 1 < len)
    {
        uint8_t *	data = NewtRefToBinary(r);
        uint32_t value = (data[p] << 8) | (data[p+1]);
        return NewtMakeInteger(value);
    }
    
    return kNewtRefUnbind;
    
}